

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<45UL,_GF2::MOLex<45UL>_> * __thiscall
GF2::MP<45UL,_GF2::MOLex<45UL>_>::operator*=(MP<45UL,_GF2::MOLex<45UL>_> *this,MM<45UL> *mRight)

{
  bool bVar1;
  _List_iterator<GF2::MM<45UL>_> *in_RSI;
  MP<45UL,_GF2::MOLex<45UL>_> *in_RDI;
  iterator iter;
  list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *in_stack_ffffffffffffffc8;
  _List_iterator<GF2::MM<45UL>_> *this_00;
  _Self local_20;
  _Self local_18;
  _List_iterator<GF2::MM<45UL>_> *local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::begin
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
                   (in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = local_10;
    std::_List_iterator<GF2::MM<45UL>_>::operator*(local_10);
    MM<45ul>::operator*=((MM<45UL> *)this_00,(MM<45UL> *)in_stack_ffffffffffffffc8);
    std::_List_iterator<GF2::MM<45UL>_>::operator++(&local_18);
  }
  Normalize(this);
  return in_RDI;
}

Assistant:

MP& operator*=(const MM<_n>& mRight)
	{	
		for (iterator iter = begin(); iter != end(); ++iter)
			(*iter) *= mRight;
		// при умножении могут появиться повторяющиеся мономы 
		// и может нарушиться порядок
		Normalize();
		return *this;
	}